

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SpecifyBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SpecifyBlockSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SyntaxList<slang::syntax::MemberSyntax> *args_2,Token *args_3)

{
  Token specify;
  Token endspecify;
  SpecifyBlockSyntax *this_00;
  
  this_00 = (SpecifyBlockSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SpecifyBlockSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (SpecifyBlockSyntax *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  specify.kind = args_1->kind;
  specify._2_1_ = args_1->field_0x2;
  specify.numFlags.raw = (args_1->numFlags).raw;
  specify.rawLen = args_1->rawLen;
  specify.info = args_1->info;
  endspecify.kind = args_3->kind;
  endspecify._2_1_ = args_3->field_0x2;
  endspecify.numFlags.raw = (args_3->numFlags).raw;
  endspecify.rawLen = args_3->rawLen;
  endspecify.info = args_3->info;
  slang::syntax::SpecifyBlockSyntax::SpecifyBlockSyntax(this_00,args,specify,args_2,endspecify);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }